

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall
ON_PolyEdgeHistoryValue::ReportHelper(ON_PolyEdgeHistoryValue *this,ON_TextLog *text_log)

{
  ON_TextLog::Print(text_log,"polyedge value\n");
  ON_TextLog::PushIndent(text_log);
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_PolyEdgeHistoryValue::ReportHelper(ON_TextLog& text_log ) const
{
  text_log.Print("polyedge value\n");
  text_log.PushIndent();
  int i, count = m_value.Count();
  for ( i = 0; i < count; i++ )
  {
    m_value[i].Dump(text_log);
  }
  text_log.PopIndent();
  return true;
}